

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

bool __thiscall
pybind11::detail::
map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
::load(map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
       *this,handle src,bool convert)

{
  handle src_00;
  handle src_01;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_98 [8];
  value_conv vconv;
  dict_iterator __begin3;
  key_conv kconv;
  dict d;
  
  if ((src.m_ptr == (PyObject *)0x0) || (((src.m_ptr)->ob_type->tp_flags & 0x20000000) == 0)) {
    bVar4 = false;
  }
  else {
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    kconv.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value.field_2._8_8_ = src.m_ptr;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
             *)this);
    uVar1 = kconv.
            super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            .value.field_2._8_8_;
    __begin3.super_dict_readonly.obj.m_ptr = (PyObject *)0x0;
    __begin3.super_dict_readonly.key = (PyObject *)0x0;
    __begin3.super_dict_readonly.value = (PyObject *)0x0;
    iVar3 = PyDict_Next();
    src_00 = __begin3.super_dict_readonly.obj;
    src_01.m_ptr = __begin3.super_dict_readonly.key;
    if (iVar3 == 0) {
      __begin3.super_dict_readonly.value = (PyObject *)0xffffffffffffffff;
    }
    while (bVar4 = __begin3.super_dict_readonly.value == (PyObject *)0xffffffffffffffff,
          __begin3.super_dict_readonly.obj.m_ptr = src_00.m_ptr,
          __begin3.super_dict_readonly.key = src_01.m_ptr, !bVar4) {
      __begin3.super_dict_readonly.pos =
           (ssize_t)&kconv.
                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .value._M_string_length;
      kconv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_dataplus._M_p = (pointer)0x0;
      kconv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value._M_string_length._0_1_ = 0;
      type_caster_generic::type_caster_generic
                ((type_caster_generic *)local_98,(type_info *)&kratos::Var::typeinfo);
      bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)&__begin3.super_dict_readonly.pos,src_00,convert);
      if ((!bVar2) ||
         (bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                            ((type_caster_generic *)local_98,src_01,convert), !bVar2)) {
        if ((size_type *)__begin3.super_dict_readonly.pos !=
            &kconv.
             super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .value._M_string_length) {
          operator_delete((void *)__begin3.super_dict_readonly.pos,
                          CONCAT71(kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        break;
      }
      vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.value =
           vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.cpptype;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
      ::_M_emplace_unique<std::__cxx11::string,kratos::Var*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__begin3.super_dict_readonly.pos,
                 (Var **)&vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.value)
      ;
      if ((size_type *)__begin3.super_dict_readonly.pos !=
          &kconv.
           super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           .value._M_string_length) {
        operator_delete((void *)__begin3.super_dict_readonly.pos,
                        CONCAT71(kconv.
                                 super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 .value._M_string_length._1_7_,
                                 (undefined1)
                                 kconv.
                                 super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 .value._M_string_length) + 1);
      }
      iVar3 = PyDict_Next(uVar1,&__begin3.super_dict_readonly.value,&__begin3,
                          &__begin3.super_dict_readonly.key);
      src_00 = __begin3.super_dict_readonly.obj;
      src_01.m_ptr = __begin3.super_dict_readonly.key;
      if (iVar3 == 0) {
        __begin3.super_dict_readonly.value = (PyObject *)0xffffffffffffffff;
      }
    }
    object::~object((object *)
                    ((long)&kconv.
                            super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            .value.field_2 + 8));
  }
  return bVar4;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }